

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

void enet_peer_disconnect(ENetPeer *peer,enet_uint32 data)

{
  size_t *psVar1;
  _ENetHost *p_Var2;
  ENetProtocol local_42;
  
  if ((ENET_PEER_STATE_ZOMBIE < peer->state) || ((0x381U >> (peer->state & 0x1f) & 1) == 0)) {
    enet_peer_reset_queues(peer);
    local_42.header.channelID = 0xff;
    local_42.connect.outgoingPeerID =
         data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    local_42.header.command = 'D';
    if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
      local_42.header.command = 0x84;
    }
    enet_peer_queue_outgoing_command(peer,&local_42,(ENetPacket *)0x0,0,0);
    if (1 < peer->state - ENET_PEER_STATE_CONNECTED) {
      enet_host_flush(peer->host);
      enet_peer_reset(peer);
      return;
    }
    p_Var2 = peer->host;
    if (peer->incomingBandwidth != 0) {
      psVar1 = &p_Var2->bandwidthLimitedPeers;
      *psVar1 = *psVar1 - 1;
    }
    psVar1 = &p_Var2->connectedPeers;
    *psVar1 = *psVar1 - 1;
    peer->state = ENET_PEER_STATE_DISCONNECTING;
  }
  return;
}

Assistant:

void
enet_peer_disconnect (ENetPeer * peer, enet_uint32 data)
{
    ENetProtocol command;

    if (peer -> state == ENET_PEER_STATE_DISCONNECTING ||
        peer -> state == ENET_PEER_STATE_DISCONNECTED ||
        peer -> state == ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT ||
        peer -> state == ENET_PEER_STATE_ZOMBIE)
      return;

    enet_peer_reset_queues (peer);

    command.header.command = ENET_PROTOCOL_COMMAND_DISCONNECT;
    command.header.channelID = 0xFF;
    command.disconnect.data = ENET_HOST_TO_NET_32 (data);

    if (peer -> state == ENET_PEER_STATE_CONNECTED || peer -> state == ENET_PEER_STATE_DISCONNECT_LATER)
      command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
    else
      command.header.command |= ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;      
    
    enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);

    if (peer -> state == ENET_PEER_STATE_CONNECTED || peer -> state == ENET_PEER_STATE_DISCONNECT_LATER)
    {
        enet_peer_on_disconnect (peer);

        peer -> state = ENET_PEER_STATE_DISCONNECTING;
    }
    else
    {
        enet_host_flush (peer -> host);
        enet_peer_reset (peer);
    }
}